

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O2

void arkInterpPrintMem_Hermite(ARKInterp interp,FILE *outfile)

{
  if (interp != (ARKInterp)0x0) {
    fprintf((FILE *)outfile,"arkode_interp (Hermite): degree = %d\n",(ulong)*interp->content);
    fprintf((FILE *)outfile,"arkode_interp (Hermite): told = %.16g\n",
            *(undefined8 *)((long)interp->content + 0x38));
    fprintf((FILE *)outfile,"arkode_interp (Hermite): tnew = %.16g\n",
            *(undefined8 *)((long)interp->content + 0x40));
    fprintf((FILE *)outfile,"arkode_interp (Hermite): h = %.16g\n",
            *(undefined8 *)((long)interp->content + 0x48));
    return;
  }
  return;
}

Assistant:

void arkInterpPrintMem_Hermite(ARKInterp interp, FILE *outfile)
{
  if (interp != NULL) {
    fprintf(outfile, "arkode_interp (Hermite): degree = %d\n", HINT_DEGREE(interp));
    fprintf(outfile, "arkode_interp (Hermite): told = %"RSYM"\n", HINT_TOLD(interp));
    fprintf(outfile, "arkode_interp (Hermite): tnew = %"RSYM"\n", HINT_TNEW(interp));
    fprintf(outfile, "arkode_interp (Hermite): h = %"RSYM"\n", HINT_H(interp));
#ifdef SUNDIALS_DEBUG_PRINTVEC
    fprintf(outfile, "arkode_interp (Hermite): fold:\n");
    N_VPrintFile(HINT_FOLD(interp), outfile);
    fprintf(outfile, "arkode_interp (Hermite): fnew:\n");
    N_VPrintFile(HINT_FNEW(interp), outfile);
    fprintf(outfile, "arkode_interp (Hermite): yold:\n");
    N_VPrintFile(HINT_YOLD(interp), outfile);
    fprintf(outfile, "arkode_interp (Hermite): ynew:\n");
    N_VPrintFile(HINT_YNEW(interp), outfile);
    fprintf(outfile, "arkode_interp (Hermite): fa:\n");
    N_VPrintFile(HINT_FA(interp), outfile);
    fprintf(outfile, "arkode_interp (Hermite): fb:\n");
    N_VPrintFile(HINT_FB(interp), outfile);
#endif
  }
}